

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DArrayDepthCase::TexImage2DArrayDepthCase
          (TexImage2DArrayDepthCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int imageWidth,int imageHeight,int numLayers)

{
  int width;
  int numLevels;
  Vector<float,_4> local_64;
  Vector<float,_4> local_48;
  TextureFormat local_38;
  int local_30;
  deUint32 local_2c;
  int imageWidth_local;
  deUint32 internalFormat_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TexImage2DArrayDepthCase *this_local;
  
  local_30 = imageWidth;
  local_2c = internalFormat;
  _imageWidth_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  local_38 = glu::mapGLInternalFormat(internalFormat);
  width = local_30;
  numLevels = maxLevelCount(local_30,imageHeight);
  Texture2DArraySpecCase::Texture2DArraySpecCase
            (&this->super_Texture2DArraySpecCase,context,name,desc,&local_38,width,imageHeight,
             numLayers,numLevels);
  (this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TexImage2DArrayDepthCase_0328ebe0;
  this->m_internalFormat = local_2c;
  tcu::Vector<float,_4>::Vector(&local_48,0.25,0.0,0.0,1.0);
  *(undefined8 *)(this->super_Texture2DArraySpecCase).m_texFormatInfo.lookupBias.m_data =
       local_48.m_data._0_8_;
  *(undefined8 *)((this->super_Texture2DArraySpecCase).m_texFormatInfo.lookupBias.m_data + 2) =
       local_48.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_64,0.5,1.0,1.0,0.0);
  *(undefined8 *)(this->super_Texture2DArraySpecCase).m_texFormatInfo.lookupScale.m_data =
       local_64.m_data._0_8_;
  *(undefined8 *)((this->super_Texture2DArraySpecCase).m_texFormatInfo.lookupScale.m_data + 2) =
       local_64.m_data._8_8_;
  return;
}

Assistant:

TexImage2DArrayDepthCase (Context&		context,
							  const char*	name,
							  const char*	desc,
							  deUint32		internalFormat,
							  int			imageWidth,
							  int			imageHeight,
							  int			numLayers)
		: Texture2DArraySpecCase(context, name, desc, glu::mapGLInternalFormat(internalFormat), imageWidth, imageHeight, numLayers, maxLevelCount(imageWidth, imageHeight))
		, m_internalFormat		(internalFormat)
	{
		// we are interested in the behavior near [-2, 2], map it to visible range [0, 1]
		m_texFormatInfo.lookupBias = Vec4(0.25f, 0.0f, 0.0f, 1.0f);
		m_texFormatInfo.lookupScale = Vec4(0.5f, 1.0f, 1.0f, 0.0f);
	}